

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

string * __thiscall
spvtools::val::(anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Decoration *decoration,Instruction *inst)

{
  int iVar1;
  Op OVar2;
  uint32_t uVar3;
  ostream *poVar4;
  Instruction *inst_00;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream ss;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  iVar1 = Decoration::struct_member_index(decoration);
  if (iVar1 == -1) {
    GetIdDesc_abi_cxx11_(&local_1c0,(_anonymous_namespace_ *)inst,inst_00);
    std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  else {
    OVar2 = val::Instruction::opcode(inst);
    if (OVar2 != OpTypeStruct) {
      __assert_fail("inst.opcode() == spv::Op::OpTypeStruct",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_builtins.cpp"
                    ,0x2fa,
                    "std::string spvtools::val::(anonymous namespace)::BuiltInsValidator::GetDefinitionDesc(const Decoration &, const Instruction &) const"
                   );
    }
    poVar4 = std::operator<<((ostream *)local_1a0,"Member #");
    iVar1 = Decoration::struct_member_index(decoration);
    std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<((ostream *)local_1a0," of struct ID <");
    uVar3 = val::Instruction::id(inst);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
    std::operator<<(poVar4,">");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string BuiltInsValidator::GetDefinitionDesc(
    const Decoration& decoration, const Instruction& inst) const {
  std::ostringstream ss;
  if (decoration.struct_member_index() != Decoration::kInvalidMember) {
    assert(inst.opcode() == spv::Op::OpTypeStruct);
    ss << "Member #" << decoration.struct_member_index();
    ss << " of struct ID <" << inst.id() << ">";
  } else {
    ss << GetIdDesc(inst);
  }
  return ss.str();
}